

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hpp
# Opt level: O2

Color32 __thiscall plot::Color::color32(Color *this,uint8_t white,uint8_t opaque)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined7 in_register_00000011;
  undefined3 in_register_00000031;
  float fVar5;
  float fVar6;
  
  fVar5 = (float)(-(uint)(0.0 <= this->r) & (uint)this->r);
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  fVar6 = (float)CONCAT31(in_register_00000031,white);
  lVar1 = lroundf(fVar5 * fVar6);
  fVar5 = (float)(-(uint)(0.0 <= this->g) & (uint)this->g);
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  lVar2 = lroundf(fVar5 * fVar6);
  fVar5 = (float)(-(uint)(0.0 <= this->b) & (uint)this->b);
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  lVar3 = lroundf(fVar5 * fVar6);
  fVar5 = (float)(-(uint)(0.0 <= this->a) & (uint)this->a);
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  lVar4 = lroundf((float)(int)CONCAT71(in_register_00000011,opaque) * fVar5);
  return (Color32)((int)lVar4 << 0x18 | ((uint)lVar3 & 0xff) << 0x10 | ((uint)lVar2 & 0xff) << 8 |
                  (uint)lVar1 & 0xff);
}

Assistant:

Color32 color32(std::uint8_t white = 255, std::uint8_t opaque = 255) const {
        using utils::clamp;
        return {
            std::uint8_t(std::lround(clamp(r, 0.0f, 1.0f)*white)),
            std::uint8_t(std::lround(clamp(g, 0.0f, 1.0f)*white)),
            std::uint8_t(std::lround(clamp(b, 0.0f, 1.0f)*white)),
            std::uint8_t(std::lround(clamp(a, 0.0f, 1.0f)*opaque))
        };
    }